

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

void __thiscall position::setup(position *this,istringstream *fen)

{
  Color *c_00;
  U64 *pUVar1;
  U16 *pUVar2;
  byte bVar3;
  ushort uVar4;
  Color us;
  uint uVar5;
  bool bVar6;
  int iVar7;
  U64 UVar8;
  mapped_type *pmVar9;
  int *piVar10;
  long lVar11;
  undefined8 uVar12;
  uint uVar13;
  char *c_1;
  Square *s_00;
  size_type sVar14;
  Color us_00;
  char *c;
  _Alloc_hider _Var15;
  Square s;
  Color stm;
  string token;
  Square local_6c;
  undefined8 local_68;
  istringstream *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Color local_34;
  
  clear(this);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_60 = fen;
  std::operator>>((istream *)fen,(string *)&local_58);
  local_6c = A8;
  if (local_58._M_string_length != 0) {
    sVar14 = local_58._M_string_length;
    _Var15._M_p = local_58._M_dataplus._M_p;
    do {
      uVar13 = (int)*_Var15._M_p - 0x30;
      if (uVar13 < 10) {
        local_6c = local_6c + uVar13;
      }
      else if (*_Var15._M_p == '/') {
        local_6c = local_6c - A3;
      }
      else {
        set_piece(this,_Var15._M_p,&local_6c);
        local_6c = local_6c + B1;
      }
      _Var15._M_p = _Var15._M_p + 1;
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
  }
  std::operator>>((istream *)local_60,(string *)&local_58);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"w");
  c_00 = &(this->ifo).stm;
  (this->ifo).stm = (uint)(iVar7 != 0);
  UVar8 = zobrist::stm(c_00);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar8;
  UVar8 = zobrist::stm(c_00);
  pUVar1 = &(this->ifo).repkey;
  *pUVar1 = *pUVar1 ^ UVar8;
  std::operator>>((istream *)local_60,(string *)&local_58);
  (this->ifo).cmask = 0;
  if (local_58._M_string_length != 0) {
    _Var15._M_p = local_58._M_dataplus._M_p;
    sVar14 = local_58._M_string_length;
    do {
      pmVar9 = std::
               map<char,_unsigned_short,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_short>_>_>
               ::at(&CastleRights,_Var15._M_p);
      uVar4 = *pmVar9;
      local_68._0_1_ = (undefined1)uVar4;
      local_68._1_1_ = (undefined1)(uVar4 >> 8);
      pUVar2 = &(this->ifo).cmask;
      *pUVar2 = *pUVar2 | uVar4;
      UVar8 = zobrist::castle(c_00,(U16 *)&local_68);
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar8;
      UVar8 = zobrist::castle(c_00,(U16 *)&local_68);
      pUVar1 = &(this->ifo).repkey;
      *pUVar1 = *pUVar1 ^ UVar8;
      _Var15._M_p = _Var15._M_p + 1;
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
  }
  std::operator>>((istream *)local_60,(string *)&local_58);
  (this->ifo).eps = no_square;
  if (local_58._M_string_length == 0) {
    uVar13 = 9;
    iVar7 = 0x48;
  }
  else {
    uVar13 = 9;
    sVar14 = 0;
    iVar7 = 9;
    do {
      bVar3 = local_58._M_dataplus._M_p[sVar14];
      uVar5 = (uint)(byte)(bVar3 + 0x9f);
      if (7 < (byte)(bVar3 + 0x9f)) {
        uVar5 = uVar13;
      }
      uVar13 = uVar5;
      if ((bVar3 == 0x36) || (bVar3 == 0x33)) {
        iVar7 = bVar3 - 0x31;
      }
      sVar14 = sVar14 + 1;
    } while (local_58._M_string_length != sVar14);
    iVar7 = iVar7 << 3;
  }
  (this->ifo).eps = iVar7 + uVar13;
  if (iVar7 + uVar13 < squares) {
    local_68._0_1_ = (char)uVar13 & 7;
    UVar8 = zobrist::ep((U8 *)&local_68);
    pUVar1 = &(this->ifo).key;
    *pUVar1 = *pUVar1 ^ UVar8;
    local_68._0_1_ = (char)(this->ifo).eps & 7;
    UVar8 = zobrist::ep((U8 *)&local_68);
    pUVar1 = &(this->ifo).repkey;
    *pUVar1 = *pUVar1 ^ UVar8;
  }
  else {
    (this->ifo).eps = no_square;
  }
  std::operator>>((istream *)local_60,(string *)&local_58);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"-");
  _Var15._M_p = local_58._M_dataplus._M_p;
  if (iVar7 == 0) {
    lVar11 = 0;
LAB_0011f511:
    local_68._0_1_ = (undefined1)lVar11;
    (this->ifo).move50 = (undefined1)local_68;
    local_68._1_1_ = white >> 8;
    UVar8 = zobrist::mv50((U16 *)&local_68);
    pUVar1 = &(this->ifo).key;
    *pUVar1 = *pUVar1 ^ UVar8;
    std::operator>>((istream *)local_60,(string *)&local_58);
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_58,"-");
    _Var15._M_p = local_58._M_dataplus._M_p;
    if (iVar7 == 0) {
      lVar11 = 0;
LAB_0011f5ae:
      (this->ifo).hmvs = (U16)lVar11;
      UVar8 = zobrist::hmvs(&(this->ifo).hmvs);
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar8;
      us = (this->ifo).stm;
      local_68._0_1_ = (undefined1)us;
      local_68._1_1_ = (undefined1)(us >> 8);
      local_68._2_2_ = (undefined2)(us >> 0x10);
      s_00 = (this->ifo).ks + us;
      *s_00 = (this->pcs).king_sq._M_elems[us];
      us_00 = (Color)((long)(int)us ^ 1U);
      local_34 = us_00;
      bVar6 = is_attacked(this,s_00,(Color *)&local_68,&local_34,0);
      (this->ifo).incheck = bVar6;
      if (bVar6) {
        local_34 = us_00;
        UVar8 = attackers_of2(this,s_00,&local_34);
      }
      else {
        UVar8 = 0;
      }
      (this->ifo).checkers = UVar8;
      UVar8 = pinned(this,us);
      (this->ifo).pinned[us] = UVar8;
      UVar8 = pinned(this,us_00);
      (this->ifo).pinned[(long)(int)us ^ 1U] = UVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
    piVar10 = __errno_location();
    iVar7 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(_Var15._M_p,(char **)&local_68,10);
    if ((pointer)CONCAT44(local_68._4_4_,
                          CONCAT22(local_68._2_2_,CONCAT11(local_68._1_1_,(undefined1)local_68))) !=
        _Var15._M_p) {
      if ((0xfffffffeffffffff < lVar11 - 0x80000000U) && (*piVar10 != 0x22)) {
        if (*piVar10 == 0) {
          *piVar10 = iVar7;
        }
        goto LAB_0011f5ae;
      }
      goto LAB_0011f6a5;
    }
  }
  else {
    piVar10 = __errno_location();
    iVar7 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(_Var15._M_p,(char **)&local_68,10);
    if ((pointer)CONCAT44(local_68._4_4_,
                          CONCAT22(local_68._2_2_,CONCAT11(local_68._1_1_,(undefined1)local_68))) ==
        _Var15._M_p) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar11 - 0x80000000U) && (*piVar10 != 0x22)) {
      if (*piVar10 == 0) {
        *piVar10 = iVar7;
      }
      goto LAB_0011f511;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0011f6a5:
  uVar12 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

void position::setup(std::istringstream& fen) {
	clear();

	std::string token;
	fen >> token;
	Square s = Square::A8;

	for (auto& c : token) {
		if (isdigit(c)) s += int(c - '0');
		else if (c == '/') s -= 16;
		else { set_piece(c, s); ++s; }
	}

	// side to move
	fen >> token;
	ifo.stm = (token == "w" ? Color::white : Color::black);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	// the castle rights
	fen >> token;
	ifo.cmask = U16(0);
	for (auto& c : token) {
		U16 cr = CastleRights.at(c);
		ifo.cmask |= cr;
		ifo.key ^= zobrist::castle(ifo.stm, cr);
		ifo.repkey ^= zobrist::castle(ifo.stm, cr);
	}


	// ep square
	fen >> token;
	ifo.eps = Square::no_square;
	Row row = Row::no_row; Col col = Col::no_col;
	for (auto& c : token) {
		if (c >= 'a' && c <= 'h') col = Col(c - 'a');
		if (c == '3' || c == '6') row = Row(c - '1');
	}
	ifo.eps = Square(8 * row + col);

	if (!util::on_board(ifo.eps)) ifo.eps = Square::no_square;

	if (ifo.eps != Square::no_square) {
		ifo.key ^= zobrist::ep(util::col(ifo.eps));
		ifo.repkey ^= zobrist::ep(util::col(ifo.eps));
	}

	// half-moves since last pawn move/capture
	fen >> token;

	ifo.move50 = (token != "-" ? U8(std::stoi(token)) : 0);

	ifo.key ^= zobrist::mv50(ifo.move50);

	// move counter
	fen >> token;
	ifo.hmvs = (token != "-" ? U16(std::stoi(token)) : 0);
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// check info
	Color stm = to_move();
	ifo.ks[stm] = pcs.king_sq[stm];
	ifo.incheck = is_attacked(ifo.ks[stm], stm, Color(stm ^ 1));

	ifo.checkers = (in_check() ? attackers_of2(ifo.ks[stm], Color(stm ^ 1)) : 0ULL);
	ifo.pinned[stm] = pinned(stm);
	ifo.pinned[stm ^ 1] = pinned(Color(stm ^ 1));
}